

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

double Catch::Benchmark::Detail::weighted_average_quantile(int k,int q,iterator first,iterator last)

{
  bool bVar1;
  reference pdVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_78 [2];
  double xj1;
  double xj;
  double *local_58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_50;
  double local_48;
  double g;
  double dStack_38;
  int j;
  double idx;
  difference_type count;
  int q_local;
  int k_local;
  iterator last_local;
  iterator first_local;
  
  count._0_4_ = q;
  count._4_4_ = k;
  _q_local = last._M_current;
  last_local = first;
  idx = (double)__gnu_cxx::operator-
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            *)&q_local,&last_local);
  dStack_38 = (double)(((long)idx + -1) * (long)count._4_4_) / (double)(int)count;
  g._4_4_ = (int)dStack_38;
  local_48 = dStack_38 - (double)g._4_4_;
  local_50._M_current = last_local._M_current;
  local_58 = (double *)
             __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator+(&last_local,(long)g._4_4_);
  xj = (double)_q_local;
  std::nth_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (local_50,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                      local_58,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)_q_local);
  pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator[](&last_local,(long)g._4_4_);
  xj1 = *pdVar2;
  bVar1 = directCompare(local_48,0.0);
  if (bVar1) {
    first_local._M_current = (double *)xj1;
  }
  else {
    __first = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator+(&last_local,(long)(g._4_4_ + 1));
    local_78[0] = std::
                  min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                            (__first,_q_local);
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(local_78);
    first_local._M_current = (double *)(local_48 * (*pdVar2 - xj1) + xj1);
  }
  return (double)first_local._M_current;
}

Assistant:

double weighted_average_quantile(int k, int q, std::vector<double>::iterator first, std::vector<double>::iterator last) {
                auto count = last - first;
                double idx = (count - 1) * k / static_cast<double>(q);
                int j = static_cast<int>(idx);
                double g = idx - j;
                std::nth_element(first, first + j, last);
                auto xj = first[j];
                if ( directCompare( g, 0 ) ) {
                    return xj;
                }

                auto xj1 = *std::min_element(first + (j + 1), last);
                return xj + g * (xj1 - xj);
            }